

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_AddTweakPubkeySecp256k1EcTest_Test::~Secp256k1_AddTweakPubkeySecp256k1EcTest_Test
          (Secp256k1_AddTweakPubkeySecp256k1EcTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Secp256k1, AddTweakPubkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPubkeyTestVector test_vector : tweak_pubkey_test_vectors) {
    ByteData actual_add;
    EXPECT_NO_THROW(
        actual_add = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey,
            test_vector.tweak, test_vector.is_check));
    EXPECT_EQ(test_vector.expect_add, actual_add.GetHex());

    ByteData actual_mul;
    EXPECT_NO_THROW(
        actual_mul = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_mul, actual_mul.GetHex());
  }
}